

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractStringValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::AbstractStringValidator::inspectFacetBase
          (AbstractStringValidator *this,MemoryManager *manager)

{
  uint uVar1;
  uint uVar2;
  DatatypeValidator *pDVar3;
  DatatypeValidator *pDVar4;
  _func_int **toFormat;
  _func_int **toFormat_00;
  _func_int **toFormat_01;
  _func_int **toFormat_02;
  _func_int **toFormat_03;
  _func_int **toFormat_04;
  XMLSize_t XVar5;
  InvalidDatatypeFacetException *this_00;
  char16_t *pcVar6;
  XMLSize_t getAt;
  XMLCh value2 [65];
  XMLCh value1 [65];
  
  pDVar3 = (this->super_DatatypeValidator).fBaseValidator;
  uVar1 = (this->super_DatatypeValidator).fFacetsDefined;
  pDVar4 = pDVar3;
  if (uVar1 == 0) {
    if (pDVar3 == (DatatypeValidator *)0x0) {
      return;
    }
    pDVar4 = (DatatypeValidator *)this->fEnumeration;
  }
  if (pDVar4 == (DatatypeValidator *)0x0) {
    return;
  }
  uVar2 = pDVar3->fFacetsDefined;
  toFormat = (_func_int **)this->fLength;
  toFormat_00 = (_func_int **)this->fMaxLength;
  toFormat_01 = (_func_int **)this->fMinLength;
  toFormat_02 = pDVar3[1].super_XSerializable._vptr_XSerializable;
  toFormat_03 = *(_func_int ***)&pDVar3[1].fFinalSet;
  toFormat_04 = *(_func_int ***)&pDVar3[1].fAnonymous;
  if ((uVar1 & 1) != 0) {
    if (toFormat_04 < toFormat && (uVar2 & 4) != 0) {
      XMLString::sizeToText((XMLSize_t)toFormat,value1,0x40,10,manager);
      XMLString::sizeToText((XMLSize_t)toFormat_04,value2,0x40,10,manager);
      this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x13c,FACET_Len_baseMaxLen,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      goto LAB_002ea437;
    }
    if (toFormat < toFormat_03 && (uVar2 & 2) != 0) {
      XMLString::sizeToText((XMLSize_t)toFormat,value1,0x40,10,manager);
      XMLString::sizeToText((XMLSize_t)toFormat_03,value2,0x40,10,manager);
      this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x145,FACET_Len_baseMinLen,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      goto LAB_002ea437;
    }
  }
  if ((uVar2 & 1) != 0) {
    if (toFormat_00 < toFormat_02 && (uVar1 & 4) != 0) {
      XMLString::sizeToText((XMLSize_t)toFormat_00,value1,0x40,10,manager);
      XMLString::sizeToText((XMLSize_t)toFormat_02,value2,0x40,10,manager);
      this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x153,FACET_maxLen_baseLen,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      goto LAB_002ea437;
    }
    if (toFormat_02 < toFormat_01 && (uVar1 & 2) != 0) {
      XMLString::sizeToText((XMLSize_t)toFormat_01,value1,0x40,10,manager);
      XMLString::sizeToText((XMLSize_t)toFormat_02,value2,0x40,10,manager);
      this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x15c,FACET_minLen_baseLen,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      goto LAB_002ea437;
    }
    if (toFormat != toFormat_02 && (uVar1 & 1) != 0) {
      XMLString::sizeToText((XMLSize_t)toFormat,value1,0x40,10,manager);
      XMLString::sizeToText((XMLSize_t)toFormat_02,value2,0x40,10,manager);
      this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x169,FACET_Len_baseLen,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      goto LAB_002ea437;
    }
  }
  if ((((uVar2 & 4) != 0) && ((uVar1 & 2) != 0)) && (toFormat_04 < toFormat_01)) {
    XMLString::sizeToText((XMLSize_t)toFormat_01,value1,0x40,10,manager);
    XMLString::sizeToText((XMLSize_t)toFormat_04,value2,0x40,10,manager);
    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
               ,0x17c,FACET_minLen_basemaxLen,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
    goto LAB_002ea437;
  }
  if ((uVar1 & 2 & uVar2) != 0) {
    if ((pDVar3->fFixed & 2U) == 0) {
      if (toFormat_01 < toFormat_03) {
        XMLString::sizeToText((XMLSize_t)toFormat_01,value1,0x40,10,manager);
        XMLString::sizeToText((XMLSize_t)toFormat_03,value2,0x40,10,manager);
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                   ,0x196,FACET_minLen_baseminLen,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
        goto LAB_002ea437;
      }
    }
    else if (toFormat_01 != toFormat_03) {
      XMLString::sizeToText((XMLSize_t)toFormat_01,value1,0x40,10,manager);
      XMLString::sizeToText((XMLSize_t)toFormat_03,value2,0x40,10,manager);
      this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x18b,FACET_minLen_base_fixed,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      goto LAB_002ea437;
    }
  }
  if ((((uVar1 & 4) != 0) && ((uVar2 & 2) != 0)) && (toFormat_00 < toFormat_03)) {
    XMLString::sizeToText((XMLSize_t)toFormat_00,value1,0x40,10,manager);
    XMLString::sizeToText((XMLSize_t)toFormat_03,value2,0x40,10,manager);
    this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
    InvalidDatatypeFacetException::InvalidDatatypeFacetException
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
               ,0x1a4,FACET_maxLen_baseminLen,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
    goto LAB_002ea437;
  }
  if ((uVar1 & 4 & uVar2) != 0) {
    if ((pDVar3->fFixed & 4U) == 0) {
      if (toFormat_04 < toFormat_00) {
        XMLString::sizeToText((XMLSize_t)toFormat_00,value1,0x40,10,manager);
        XMLString::sizeToText((XMLSize_t)toFormat_04,value2,0x40,10,manager);
        this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (this_00,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                   ,0x1bd,FACET_maxLen_basemaxLen,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
LAB_002ea437:
        __cxa_throw(this_00,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
      }
    }
    else if (toFormat_00 != toFormat_04) {
      XMLString::sizeToText((XMLSize_t)toFormat_00,value1,0x40,10,manager);
      XMLString::sizeToText((XMLSize_t)toFormat_04,value2,0x40,10,manager);
      this_00 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (this_00,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractStringValidator.cpp"
                 ,0x1b3,FACET_maxLen_base_fixed,value1,value2,(XMLCh *)0x0,(XMLCh *)0x0,manager);
      goto LAB_002ea437;
    }
  }
  if (((uVar1 & 0x10) != 0) && (this->fEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) {
    XVar5 = (this->fEnumeration->super_BaseRefVectorOf<char16_t>).fCurCount;
    for (getAt = 0; XVar5 != getAt; getAt = getAt + 1) {
      pcVar6 = BaseRefVectorOf<char16_t>::elementAt
                         (&this->fEnumeration->super_BaseRefVectorOf<char16_t>,getAt);
      (*(pDVar3->super_XSerializable)._vptr_XSerializable[0x14])(pDVar3,pcVar6,0,0,manager);
    }
  }
  (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xe])(this,manager);
  return;
}

Assistant:

void AbstractStringValidator::inspectFacetBase(MemoryManager* const manager)
{

    AbstractStringValidator *pBaseValidator = (AbstractStringValidator*) getBaseValidator();
    int thisFacetsDefined = getFacetsDefined();

    if ( (!thisFacetsDefined && !fEnumeration) ||
         (!pBaseValidator)                      )
        return;

    int baseFacetsDefined = pBaseValidator->getFacetsDefined();

    XMLSize_t thisLength    = getLength();
    XMLSize_t thisMinLength = getMinLength();
    XMLSize_t thisMaxLength = getMaxLength();

    XMLSize_t baseLength    = pBaseValidator->getLength();
    XMLSize_t baseMinLength = pBaseValidator->getMinLength();
    XMLSize_t baseMaxLength = pBaseValidator->getMaxLength();
    int baseFixed     = pBaseValidator->getFixed();

    /***
       check facets against base.facets
       Note: later we need to check the "fix" option of the base type
            and apply that to every individual facet.
    ***/

    /***
                Non coexistence of derived' length and base'    (minLength | maxLength)
                                   base'    length and derived' (minLength | maxLength)

     E2-35
     It is an error for both length and either of minLength or maxLength to be members of {facets},
     unless they are specified in different derivation steps in which case the following must be true:
     the {value} of minLength <= the {value} of length <= the {value} of maxLength
    ***/

    // error: length > base.maxLength
    //        length < base.minLength
    if ((thisFacetsDefined & DatatypeValidator::FACET_LENGTH) !=0)
    {
        if (((baseFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0) &&
             (thisLength > baseMaxLength)                                   )
        {
            REPORT_FACET_ERROR(thisLength
                             , baseMaxLength
                             , XMLExcepts::FACET_Len_baseMaxLen
                             , manager)
        }

        if (((baseFacetsDefined & DatatypeValidator::FACET_MINLENGTH) !=0) &&
             (thisLength < baseMinLength)                                   )
        {
            REPORT_FACET_ERROR(thisLength
                             , baseMinLength
                             , XMLExcepts::FACET_Len_baseMinLen
                             , manager)
        }
    }

    // error: baseLength > maxLength
    //        baseLength < minLength
    if ((baseFacetsDefined & DatatypeValidator::FACET_LENGTH) !=0)
    {
        if (((thisFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0) &&
             (baseLength > thisMaxLength)                                   )
        {
            REPORT_FACET_ERROR(thisMaxLength
                             , baseLength
                             , XMLExcepts::FACET_maxLen_baseLen
                             , manager)
        }

        if (((thisFacetsDefined & DatatypeValidator::FACET_MINLENGTH) !=0) &&
             (baseLength < thisMinLength)                                   )
        {
            REPORT_FACET_ERROR(thisMinLength
                             , baseLength
                             , XMLExcepts::FACET_minLen_baseLen
                             , manager)
        }
    }

    // check 4.3.1.c2 error: length != base.length
    if (((thisFacetsDefined & DatatypeValidator::FACET_LENGTH) !=0) &&
        ((baseFacetsDefined & DatatypeValidator::FACET_LENGTH) !=0))
    {
        if ( thisLength != baseLength )
        {
            REPORT_FACET_ERROR(thisLength
                             , baseLength
                             , XMLExcepts::FACET_Len_baseLen
                             , manager)
        }
    }

    /***
                                   |---  derived   ---|
                base.minLength <= minLength <= maxLength <= base.maxLength
                |-------------------        base      -------------------|
    ***/

    // check 4.3.2.c1 must: minLength <= base.maxLength
    if (((thisFacetsDefined & DatatypeValidator::FACET_MINLENGTH ) != 0) &&
        ((baseFacetsDefined & DatatypeValidator::FACET_MAXLENGTH ) != 0))
    {
        if ( thisMinLength > baseMaxLength )
        {
            REPORT_FACET_ERROR(thisMinLength
                             , baseMaxLength
                             , XMLExcepts::FACET_minLen_basemaxLen
                             , manager)
        }
    }

    // check 4.3.2.c2 error: minLength < base.minLength
    if (((thisFacetsDefined & DatatypeValidator::FACET_MINLENGTH) !=0) &&
        ((baseFacetsDefined & DatatypeValidator::FACET_MINLENGTH) != 0))
    {
        if ((baseFixed & DatatypeValidator::FACET_MINLENGTH) !=0)
        {
            if ( thisMinLength != baseMinLength )
            {
                REPORT_FACET_ERROR(thisMinLength
                                 , baseMinLength
                                 , XMLExcepts::FACET_minLen_base_fixed
                                 , manager)
            }

        }
        else
        {
            if ( thisMinLength < baseMinLength )
            {
                REPORT_FACET_ERROR(thisMinLength
                                 , baseMinLength
                                 , XMLExcepts::FACET_minLen_baseminLen
                                 , manager)
            }
        }
    }

    // check 4.3.2.c1 must: base.minLength <= maxLength
    if (((baseFacetsDefined & DatatypeValidator::FACET_MINLENGTH) !=0) &&
        ((thisFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0))
    {
        if ( baseMinLength > thisMaxLength )
        {
            REPORT_FACET_ERROR(thisMaxLength
                             , baseMinLength
                             , XMLExcepts::FACET_maxLen_baseminLen
                             , manager)
        }
    }

    // check 4.3.3.c1 error: maxLength > base.maxLength
    if (((thisFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0) &&
        ((baseFacetsDefined & DatatypeValidator::FACET_MAXLENGTH) !=0))
    {
        if ((baseFixed & DatatypeValidator::FACET_MAXLENGTH) !=0)
        {
            if ( thisMaxLength != baseMaxLength )
            {
                REPORT_FACET_ERROR(thisMaxLength
                                 , baseMaxLength
                                 , XMLExcepts::FACET_maxLen_base_fixed
                                 , manager)
            }
        }
        else
        {
            if ( thisMaxLength > baseMaxLength )
            {
                REPORT_FACET_ERROR(thisMaxLength
                                 , baseMaxLength
                                 , XMLExcepts::FACET_maxLen_basemaxLen
                                 , manager)
            }
        }
    }

    // check 4.3.5.c0 must: enumeration values from the value space of base
    if ( ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0) &&
        (getEnumeration() !=0))
    {
        XMLSize_t i = 0;
        XMLSize_t enumLength = getEnumeration()->size();
        for ( ; i < enumLength; i++)
        {
            // ask parent do a complete check
            pBaseValidator->checkContent(getEnumeration()->elementAt(i), (ValidationContext*)0, false, manager);
#if 0
// spec says that only base has to checkContent
            // enum shall pass this->checkContent() as well.
            checkContent(getEnumeration()->elementAt(i), (ValidationContext*)0, false, manager);
#endif
        }
    }

    checkAdditionalFacetConstraints(manager);

}